

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O1

void prf_messages_exit(void)

{
  prf_msg_handler_t **pppVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = prf_array_count(prf_handlers[1]);
  pppVar1 = prf_handlers[1];
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      if (pppVar1[uVar3] != (prf_msg_handler_t *)0x0) {
        free(pppVar1[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  prf_array_free(prf_handlers[1]);
  uVar2 = prf_array_count(prf_handlers[2]);
  pppVar1 = prf_handlers[2];
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      if (pppVar1[uVar3] != (prf_msg_handler_t *)0x0) {
        free(pppVar1[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  prf_array_free(prf_handlers[2]);
  uVar2 = prf_array_count(prf_handlers[3]);
  pppVar1 = prf_handlers[3];
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      if (pppVar1[uVar3] != (prf_msg_handler_t *)0x0) {
        free(pppVar1[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  prf_array_free(prf_handlers[3]);
  uVar2 = prf_array_count(prf_handlers[4]);
  pppVar1 = prf_handlers[4];
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      if (pppVar1[uVar3] != (prf_msg_handler_t *)0x0) {
        free(pppVar1[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  prf_array_free(prf_handlers[4]);
  uVar2 = prf_array_count(prf_handlers[5]);
  pppVar1 = prf_handlers[5];
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      if (pppVar1[uVar3] != (prf_msg_handler_t *)0x0) {
        free(pppVar1[uVar3]);
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  prf_array_free(prf_handlers[5]);
  return;
}

Assistant:

void
prf_messages_exit(
    void )
{
    int i, count;

    count = prf_array_count( prf_handlers[ PRF_MSG_INFO ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_INFO ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_INFO ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_INFO ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_DEBUG ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_DEBUG ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_DEBUG ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_DEBUG ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_WARNING ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_WARNING ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_WARNING ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_WARNING ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_ERROR ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_ERROR ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_ERROR ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_ERROR ] );

    count = prf_array_count( prf_handlers[ PRF_MSG_FATAL_ERROR ] );
    for ( i = 0; i < count; i++ ) {
        if ( prf_handlers[ PRF_MSG_FATAL_ERROR ][ i ] != NULL ) {
            free( prf_handlers[ PRF_MSG_FATAL_ERROR ][ i ] );
        }
    }
    prf_array_free( prf_handlers[ PRF_MSG_FATAL_ERROR ] );
}